

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O3

void __thiscall PatternModel::setEffectParam(PatternModel *this,uint8_t nibble)

{
  uint8_t oldData;
  uint uVar1;
  int iVar2;
  uint8_t newData;
  TrackRow *pTVar3;
  EffectEditCmd *this_00;
  QUndoStack *pQVar4;
  QArrayData *local_40 [3];
  
  iVar2 = ((this->mCursor).super_PatternCursorBase.column + -3) / 3;
  pTVar3 = trackerboy::Pattern::getTrackRow
                     (&this->mPatternCurr,(ChType)(this->mCursor).super_PatternCursorBase.track,
                      (uint)(ushort)(this->mCursor).super_PatternCursorBase.row);
  if ((pTVar3->effects)._M_elems[iVar2].type != noEffect) {
    uVar1 = (this->mCursor).super_PatternCursorBase.column;
    newData = replaceNibble((pTVar3->effects)._M_elems[iVar2].param,nibble,
                            (bool)((byte)(0x490 >> ((byte)uVar1 & 0x1f)) & uVar1 < 0xb));
    oldData = (pTVar3->effects)._M_elems[iVar2].param;
    if (newData != oldData) {
      this_00 = (EffectEditCmd *)operator_new(0x20);
      EffectEditCmd::EffectEditCmd(this_00,this,(uint8_t)iVar2,newData,oldData,(QUndoCommand *)0x0);
      *(undefined ***)&this_00->super_TrackEditCmd = &PTR__QUndoCommand_00200928;
      QMetaObject::tr((char *)local_40,(char *)&staticMetaObject,0x1b5f23);
      QUndoCommand::setText((QString *)this_00);
      if (local_40[0] != (QArrayData *)0x0) {
        LOCK();
        (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_40[0],2,8);
        }
      }
      pQVar4 = Module::undoStack(this->mModule);
      QUndoStack::push((QUndoCommand *)pQVar4);
    }
  }
  return;
}

Assistant:

void PatternModel::setEffectParam(uint8_t nibble) {
    auto effectNo = cursorEffectNo();
    auto &rowdata = cursorTrackRow();

    auto &oldEffect = rowdata.effects[effectNo];
    if (oldEffect.type != trackerboy::EffectType::noEffect) {
        bool isHighNibble = mCursor.column == PatternCursor::ColumnEffect1ArgHigh ||
                            mCursor.column == PatternCursor::ColumnEffect2ArgHigh ||
                            mCursor.column == PatternCursor::ColumnEffect3ArgHigh;
        auto newParam = replaceNibble(oldEffect.param, nibble, isHighNibble);
        if (newParam != oldEffect.param) {
            auto cmd = new EffectParamEditCmd(
                *this,
                (uint8_t)effectNo,
                newParam,
                oldEffect.param
            );
            cmd->setText(tr("edit effect parameter"));
            mModule.undoStack()->push(cmd);
        }
    }
        
}